

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O2

int run_test_error_message(void)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStackY_60;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  char buf [32];
  
  pcVar2 = uv_strerror(0);
  iVar1 = strcmp(pcVar2,"Success");
  if (iVar1 != 0) {
    puts("i18n error messages detected, skipping test.");
    return 0;
  }
  pcVar2 = uv_strerror(-0x16);
  pcVar2 = strstr(pcVar2,"Success");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = uv_strerror(0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    pcVar2 = (char *)(long)iVar1;
    buf._0_8_ = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = uv_strerror(-0x539);
      iVar1 = strcmp(pcVar2,"Unknown error");
      pcVar2 = (char *)(long)iVar1;
      buf._0_8_ = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = uv_strerror_r(-0x16,buf,0x20);
        pcVar2 = strstr(pcVar2,"Success");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = uv_strerror_r(0x539,buf,0x20);
          pcVar2 = strstr(pcVar2,"1337");
          if (pcVar2 == (char *)0x0) {
            pcVar4 = "!=";
            pcVar6 = "!=";
            pcVar2 = (char *)0x0;
            pcVar5 = "NULL";
            __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
            pcVar3 = "strstr(uv_strerror_r(1337, buf, sizeof(buf)), \"1337\")";
            uStackY_60 = 0x3a;
          }
          else {
            pcVar2 = uv_strerror_r(-0x539,buf,0x20);
            pcVar2 = strstr(pcVar2,"-1337");
            if (pcVar2 != (char *)0x0) {
              return 0;
            }
            pcVar4 = "!=";
            pcVar6 = "!=";
            pcVar2 = (char *)0x0;
            pcVar5 = "NULL";
            __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
            pcVar3 = "strstr(uv_strerror_r(-1337, buf, sizeof(buf)), \"-1337\")";
            uStackY_60 = 0x3b;
          }
        }
        else {
          pcVar4 = "==";
          pcVar6 = "==";
          pcVar5 = "NULL";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar3 = "strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), \"Success\")";
          uStackY_60 = 0x39;
        }
      }
      else {
        pcVar4 = "==";
        pcVar6 = "==";
        pcVar5 = "0";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar3 = "strcmp(uv_strerror(-1337), \"Unknown error\")";
        uStackY_60 = 0x37;
      }
    }
    else {
      pcVar4 = "==";
      pcVar6 = "==";
      pcVar5 = "0";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      pcVar3 = "strcmp(uv_strerror(1337), \"Unknown error\")";
      uStackY_60 = 0x36;
    }
  }
  else {
    pcVar4 = "==";
    pcVar6 = "==";
    pcVar5 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "strstr(uv_strerror(UV_EINVAL), \"Success\")";
    uStackY_60 = 0x35;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
          ,uStackY_60,pcVar3,pcVar4,pcVar5,pcVar2,pcVar6,0);
  abort();
}

Assistant:

TEST_IMPL(error_message) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  char buf[32];

  /* Cop out. Can't do proper checks on systems with
   * i18n-ized error messages...
   */
  if (strcmp(uv_strerror(0), "Success") != 0) {
    printf("i18n error messages detected, skipping test.\n");
    return 0;
  }

  ASSERT_NULL(strstr(uv_strerror(UV_EINVAL), "Success"));
  ASSERT_OK(strcmp(uv_strerror(1337), "Unknown error"));
  ASSERT_OK(strcmp(uv_strerror(-1337), "Unknown error"));

  ASSERT_NULL(strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), "Success"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(1337, buf, sizeof(buf)), "1337"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(-1337, buf, sizeof(buf)), "-1337"));

  return 0;
}